

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_load_module(MIR_context_t ctx,MIR_module_t_conflict m)

{
  bool bVar1;
  MIR_item_t_conflict item_00;
  int iVar2;
  void *pvVar3;
  char *name;
  MIR_error_func_t p_Var4;
  MIR_item_t_conflict first_item;
  MIR_item_t_conflict item;
  int lref_p;
  MIR_module_t_conflict m_local;
  MIR_context_t ctx_local;
  
  bVar1 = false;
  if (m == (MIR_module_t_conflict)0x0) {
    __assert_fail("m != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x765,"void MIR_load_module(MIR_context_t, MIR_module_t)");
  }
  first_item = DLIST_MIR_item_t_head(&m->items);
  do {
    item_00 = first_item;
    if (first_item == (MIR_item_t_conflict)0x0) {
      if (bVar1) {
        link_module_lrefs(ctx,m);
      }
      VARR_MIR_module_tpush(ctx->modules_to_link,m);
      return;
    }
    if ((((first_item->item_type == MIR_bss_item) || (first_item->item_type == MIR_data_item)) ||
        (first_item->item_type == MIR_ref_data_item)) ||
       ((first_item->item_type == MIR_lref_data_item ||
        (first_item->item_type == MIR_expr_data_item)))) {
      if (first_item->item_type == MIR_lref_data_item) {
        bVar1 = true;
      }
      first_item = load_bss_data_section(ctx,first_item,0);
    }
    else if (first_item->item_type == MIR_func_item) {
      if (first_item->addr == (void *)0x0) {
        pvVar3 = _MIR_get_thunk(ctx);
        first_item->addr = pvVar3;
      }
      _MIR_redirect_thunk(ctx,first_item->addr,undefined_interface);
    }
    if (item_00->export_p != '\0') {
      if (((item_00->item_type == MIR_export_item) || (item_00->item_type == MIR_import_item)) ||
         (item_00->item_type == MIR_forward_item)) {
        __assert_fail("first_item->item_type != MIR_export_item && first_item->item_type != MIR_import_item && first_item->item_type != MIR_forward_item"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x77b,"void MIR_load_module(MIR_context_t, MIR_module_t)");
      }
      name = MIR_item_name(ctx,item_00);
      iVar2 = setup_global(ctx,name,item_00->addr,item_00);
      if (((iVar2 != 0) && (first_item->item_type == MIR_func_item)) &&
         (ctx->func_redef_permission_p == 0)) {
        p_Var4 = MIR_get_error_func(ctx);
        (*p_Var4)(MIR_repeated_decl_error,"func %s is prohibited for redefinition",
                  ((first_item->u).func)->name);
      }
    }
    first_item = DLIST_MIR_item_t_next(first_item);
  } while( true );
}

Assistant:

void MIR_load_module (MIR_context_t ctx, MIR_module_t m) {
  int lref_p = FALSE;
  mir_assert (m != NULL);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    MIR_item_t first_item = item;

    if (item->item_type == MIR_bss_item || item->item_type == MIR_data_item
        || item->item_type == MIR_ref_data_item || item->item_type == MIR_lref_data_item
        || item->item_type == MIR_expr_data_item) {
      if (item->item_type == MIR_lref_data_item) lref_p = TRUE;
      item = load_bss_data_section (ctx, item, FALSE);
    } else if (item->item_type == MIR_func_item) {
      if (item->addr == NULL) {
        item->addr = _MIR_get_thunk (ctx);
#if defined(MIR_DEBUG)
        fprintf (stderr, "%016llx: %s\n", (unsigned long long) item->addr, item->u.func->name);
#endif
      }
      _MIR_redirect_thunk (ctx, item->addr, undefined_interface);
    }
    if (first_item->export_p) { /* update global item table */
      mir_assert (first_item->item_type != MIR_export_item
                  && first_item->item_type != MIR_import_item
                  && first_item->item_type != MIR_forward_item);
      if (setup_global (ctx, MIR_item_name (ctx, first_item), first_item->addr, first_item)
          && item->item_type == MIR_func_item
          && !func_redef_permission_p
#ifdef __APPLE__
          /* macosx can have multiple equal external inline definitions of the same function: */
          && strncmp (item->u.func->name, "__darwin", 8) != 0
#endif
      )
        MIR_get_error_func (ctx) (MIR_repeated_decl_error, "func %s is prohibited for redefinition",
                                  item->u.func->name);
    }
  }
  if (lref_p) link_module_lrefs (ctx, m);
  VARR_PUSH (MIR_module_t, modules_to_link, m);
}